

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O0

void integral_images_highbd
               (uint16_t *src,int src_stride,int width,int height,int32_t *A,int32_t *B,
               int buf_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i v;
  __m256i v_00;
  __m256i x;
  __m256i x_00;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int in_ECX;
  int in_EDX;
  undefined8 *a;
  long in_R8;
  long in_R9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  longlong lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar18;
  int in_stack_00000008;
  __m256i row2;
  __m256i row1;
  __m256i sc2;
  __m256i sc1;
  __m256i x2;
  __m256i x1;
  __m256i above2;
  __m256i above1;
  int ABj;
  int j;
  __m256i ldiff2;
  __m256i ldiff1;
  int i;
  __m256i zero;
  void *in_stack_fffffffffffffb60;
  __m256i *in_stack_fffffffffffffb68;
  int32_t *in_stack_fffffffffffffb70;
  undefined8 local_480;
  undefined8 uStack_478;
  void *a_00;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined1 auVar19 [16];
  int local_364;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  int local_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  long local_2d0;
  long local_2c8;
  int local_2bc;
  int local_2b8;
  uint local_2a8;
  uint local_2a4;
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  undefined8 local_280;
  undefined8 uStack_278;
  void *pvStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [16];
  longlong lStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [16];
  longlong lStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [32];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  undefined1 auVar17 [16];
  
  local_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  local_300 = 0;
  uStack_2f8 = 0;
  uStack_2f0 = 0;
  uStack_2e8 = 0;
  local_2d0 = in_R9;
  local_2c8 = in_R8;
  local_2bc = in_ECX;
  local_2b8 = in_EDX;
  memset_zero_avx(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                  (size_t)in_stack_fffffffffffffb60);
  a = &local_300;
  memset_zero_avx(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                  (size_t)in_stack_fffffffffffffb60);
  auVar16._8_8_ = auStack_290._8_8_;
  auVar16._0_8_ = auStack_290._0_8_;
  auVar12._8_8_ = local_2a0._8_8_;
  auVar12._0_8_ = local_2a0._0_8_;
  for (local_304 = 0; auVar1._8_8_ = uStack_2e8, auVar1._0_8_ = uStack_2f0,
      auVar2._8_8_ = uStack_2f8, auVar2._0_8_ = local_300, local_304 < local_2bc;
      local_304 = local_304 + 1) {
    *(undefined4 *)(local_2d0 + (long)((local_304 + 1) * in_stack_00000008) * 4) = 0;
    *(undefined4 *)(local_2c8 + (long)((local_304 + 1) * in_stack_00000008) * 4) = 0;
    local_340 = local_300;
    uStack_338 = uStack_2f8;
    uStack_330 = uStack_2f0;
    uStack_328 = uStack_2e8;
    for (local_364 = 0; local_364 < local_2b8; local_364 = local_364 + 8) {
      auVar11 = auVar2;
      auVar15 = auVar1;
      local_2a0 = auVar12;
      auStack_290 = auVar16;
      yy_load_256((__m256i *)
                  (local_2d0 + (long)(local_364 + 1) * 4 + (long)(local_304 * in_stack_00000008) * 4
                  ),a);
      auVar12 = auVar11;
      auVar16 = auVar15;
      yy_load_256((__m256i *)
                  (local_2c8 + (long)(local_364 + 1) * 4 + (long)(local_304 * in_stack_00000008) * 4
                  ),a);
      auVar13 = auVar12;
      auVar17 = auVar16;
      yy256_load_extend_16_32(in_stack_fffffffffffffb60);
      uStack_e8 = auVar17._8_8_;
      lVar14 = auVar17._0_8_;
      auVar10._16_8_ = lVar14;
      auVar10._0_16_ = auVar13;
      auVar10._24_8_ = uStack_e8;
      auVar9._16_8_ = lVar14;
      auVar9._0_16_ = auVar13;
      auVar9._24_8_ = uStack_e8;
      auVar4 = vpmaddwd_avx2(auVar10,auVar9);
      local_400 = auVar4._0_8_;
      uStack_3f8 = auVar4._8_8_;
      uStack_3f0 = auVar4._16_8_;
      uVar18 = auVar4._24_8_;
      x[1] = auVar13._0_8_;
      x[0] = uVar18;
      x[2] = auVar13._8_8_;
      x[3] = lVar14;
      lStack_f0 = lVar14;
      lStack_d0 = lVar14;
      uStack_c8 = uStack_e8;
      auVar19 = auVar13;
      local_100 = auVar13;
      local_e0 = auVar13;
      scan_32(x);
      x_00[1] = auVar19._0_8_;
      x_00[0] = uVar18;
      x_00[2] = auVar19._8_8_;
      x_00[3] = lVar14;
      scan_32(x_00);
      auVar8._16_8_ = auVar17._0_8_;
      auVar8._0_16_ = auVar13;
      auVar8._24_8_ = auVar17._8_8_;
      auVar7._16_8_ = auVar15._0_8_;
      auVar7._0_16_ = auVar11;
      auVar7._24_8_ = auVar15._8_8_;
      local_180 = vpaddd_avx2(auVar8,auVar7);
      local_1a0 = local_340;
      uStack_198 = uStack_338;
      uStack_190 = uStack_330;
      uStack_188 = uStack_328;
      auVar4._8_8_ = uStack_338;
      auVar4._0_8_ = local_340;
      auVar4._16_8_ = uStack_330;
      auVar4._24_8_ = uStack_328;
      auVar4 = vpaddd_avx2(local_180,auVar4);
      auVar6._8_8_ = uStack_3f8;
      auVar6._0_8_ = local_400;
      auVar6._16_8_ = uStack_3f0;
      auVar6._24_8_ = uVar18;
      auVar5._16_8_ = auVar16._0_8_;
      auVar5._0_16_ = auVar12;
      auVar5._24_8_ = auVar16._8_8_;
      local_200 = vpaddd_avx2(auVar6,auVar5);
      auVar3._16_8_ = auVar1._0_8_;
      auVar3._0_16_ = auVar2;
      auVar3._24_8_ = auVar1._8_8_;
      auVar3 = vpaddd_avx2(local_200,auVar3);
      a_00 = auVar3._16_8_;
      v[1] = (longlong)in_stack_fffffffffffffb60;
      v[0] = 0xa3ac96;
      v[2] = (longlong)in_stack_fffffffffffffb68;
      v[3] = (longlong)in_stack_fffffffffffffb70;
      local_1c0 = local_400;
      uStack_1b8 = uStack_3f8;
      uStack_1b0 = uStack_3f0;
      uStack_1a8 = uVar18;
      local_140 = auVar13;
      auStack_130 = auVar17;
      local_220 = auVar2;
      auStack_210 = auVar1;
      local_160 = auVar11;
      auStack_150 = auVar15;
      local_1e0 = auVar12;
      auStack_1d0 = auVar16;
      yy_store_256(a_00,v);
      v_00[1] = (longlong)in_stack_fffffffffffffb60;
      v_00[0] = 0xa3accb;
      v_00[2] = (longlong)in_stack_fffffffffffffb68;
      v_00[3] = (longlong)in_stack_fffffffffffffb70;
      yy_store_256(a_00,v_00);
      local_460 = auVar4._0_8_;
      local_240 = local_460;
      uStack_458 = auVar4._8_8_;
      uStack_238 = uStack_458;
      uStack_450 = auVar4._16_8_;
      uStack_230 = uStack_450;
      uStack_448 = auVar4._24_8_;
      uStack_228 = uStack_448;
      auVar2 = vpsubd_avx(auVar4._16_16_,auVar15);
      local_2a4 = auVar2._12_4_;
      auVar2 = vpinsrd_avx(ZEXT416(local_2a4),local_2a4,1);
      auVar2 = vpinsrd_avx(auVar2,local_2a4,2);
      local_c0 = vpinsrd_avx(auVar2,local_2a4,3);
      auVar2 = vpinsrd_avx(ZEXT416(local_2a4),local_2a4,1);
      auVar2 = vpinsrd_avx(auVar2,local_2a4,2);
      auStack_b0 = vpinsrd_avx(auVar2,local_2a4,3);
      local_340 = local_c0._0_8_;
      uStack_338 = local_c0._8_8_;
      uStack_330 = auStack_b0._0_8_;
      uStack_328 = auStack_b0._8_8_;
      local_480 = auVar3._0_8_;
      local_280 = local_480;
      uStack_478 = auVar3._8_8_;
      uStack_278 = uStack_478;
      uStack_468 = auVar3._24_8_;
      uStack_268 = uStack_468;
      auVar2 = vpsubd_avx(auVar3._16_16_,auVar16);
      local_2a8 = auVar2._12_4_;
      a = (undefined8 *)(ulong)local_2a8;
      auVar2 = vpinsrd_avx(ZEXT416(local_2a8),local_2a8,1);
      auVar2 = vpinsrd_avx(auVar2,local_2a8,2);
      auVar2 = vpinsrd_avx(auVar2,local_2a8,3);
      auVar1 = vpinsrd_avx(ZEXT416(local_2a8),local_2a8,1);
      auVar1 = vpinsrd_avx(auVar1,local_2a8,2);
      auVar1 = vpinsrd_avx(auVar1,local_2a8,3);
      local_80._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
      local_80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
      pvStack_270 = a_00;
      local_a0 = local_2a4;
      local_9c = local_2a4;
      local_98 = local_2a4;
      local_94 = local_2a4;
      local_90 = local_2a4;
      local_8c = local_2a4;
      local_88 = local_2a4;
      local_84 = local_2a4;
      local_50 = local_2a8;
      local_4c = local_2a8;
      local_48 = local_2a8;
      local_44 = local_2a8;
      local_40 = local_2a8;
      local_3c = local_2a8;
      local_38 = local_2a8;
      local_34 = local_2a8;
      auVar2 = local_80._0_16_;
      auVar1 = local_80._16_16_;
      local_260 = auVar11;
      auStack_250 = auVar15;
    }
  }
  return;
}

Assistant:

static void integral_images_highbd(const uint16_t *src, int src_stride,
                                   int width, int height, int32_t *A,
                                   int32_t *B, int buf_stride) {
  // Write out the zero top row
  memset(A, 0, sizeof(*A) * (width + 1));
  memset(B, 0, sizeof(*B) * (width + 1));

  const __m128i zero = _mm_setzero_si128();
  for (int i = 0; i < height; ++i) {
    // Zero the left column.
    A[(i + 1) * buf_stride] = B[(i + 1) * buf_stride] = 0;

    // ldiff is the difference H - D where H is the output sample immediately
    // to the left and D is the output sample above it. These are scalars,
    // replicated across the four lanes.
    __m128i ldiff1 = zero, ldiff2 = zero;
    for (int j = 0; j < width; j += 4) {
      const int ABj = 1 + j;

      const __m128i above1 = xx_load_128(B + ABj + i * buf_stride);
      const __m128i above2 = xx_load_128(A + ABj + i * buf_stride);

      const __m128i x1 = xx_load_extend_16_32(src + j + i * src_stride);
      const __m128i x2 = _mm_madd_epi16(x1, x1);

      const __m128i sc1 = scan_32(x1);
      const __m128i sc2 = scan_32(x2);

      const __m128i row1 = _mm_add_epi32(_mm_add_epi32(sc1, above1), ldiff1);
      const __m128i row2 = _mm_add_epi32(_mm_add_epi32(sc2, above2), ldiff2);

      xx_store_128(B + ABj + (i + 1) * buf_stride, row1);
      xx_store_128(A + ABj + (i + 1) * buf_stride, row2);

      // Calculate the new H - D.
      ldiff1 = _mm_shuffle_epi32(_mm_sub_epi32(row1, above1), 0xff);
      ldiff2 = _mm_shuffle_epi32(_mm_sub_epi32(row2, above2), 0xff);
    }
  }
}